

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O2

RuleBasedBreakIterator * __thiscall
icu_63::RuleBasedBreakIterator::operator=(RuleBasedBreakIterator *this,RuleBasedBreakIterator *that)

{
  StringCharacterIterator *this_00;
  int32_t pos;
  int32_t ruleStatus;
  CharacterIterator *pCVar1;
  uint in_EAX;
  int iVar2;
  undefined4 extraout_var;
  RBBIDataWrapper *pRVar3;
  uint uStack_28;
  UErrorCode status;
  
  if (this != that) {
    uStack_28 = in_EAX;
    BreakIterator::operator=(&this->super_BreakIterator,&that->super_BreakIterator);
    if (this->fLanguageBreakEngines != (UStack *)0x0) {
      (*(this->fLanguageBreakEngines->super_UVector).super_UObject._vptr_UObject[1])();
      this->fLanguageBreakEngines = (UStack *)0x0;
    }
    _uStack_28 = (ulong)uStack_28;
    utext_clone_63(&this->fText,&that->fText,'\0','\x01',&status);
    pCVar1 = this->fCharIter;
    this_00 = &this->fSCharIter;
    if (pCVar1 != (CharacterIterator *)0x0 && (StringCharacterIterator *)pCVar1 != this_00) {
      (*(pCVar1->super_ForwardCharacterIterator).super_UObject._vptr_UObject[1])();
    }
    this->fCharIter = (CharacterIterator *)this_00;
    pCVar1 = that->fCharIter;
    if ((StringCharacterIterator *)pCVar1 != &that->fSCharIter && pCVar1 != (CharacterIterator *)0x0
       ) {
      iVar2 = (*(pCVar1->super_ForwardCharacterIterator).super_UObject._vptr_UObject[8])();
      this->fCharIter = (CharacterIterator *)CONCAT44(extraout_var,iVar2);
    }
    StringCharacterIterator::operator=(this_00,&that->fSCharIter);
    if (this->fCharIter == (CharacterIterator *)0x0) {
      this->fCharIter = (CharacterIterator *)this_00;
    }
    if (this->fData != (RBBIDataWrapper *)0x0) {
      RBBIDataWrapper::removeReference(this->fData);
      this->fData = (RBBIDataWrapper *)0x0;
    }
    if (that->fData != (RBBIDataWrapper *)0x0) {
      pRVar3 = RBBIDataWrapper::addReference(that->fData);
      this->fData = pRVar3;
    }
    pos = that->fPosition;
    this->fPosition = pos;
    ruleStatus = that->fRuleStatusIndex;
    this->fRuleStatusIndex = ruleStatus;
    this->fDone = that->fDone;
    BreakCache::reset(this->fBreakCache,pos,ruleStatus);
    DictionaryCache::reset(this->fDictionaryCache);
  }
  return this;
}

Assistant:

RuleBasedBreakIterator&
RuleBasedBreakIterator::operator=(const RuleBasedBreakIterator& that) {
    if (this == &that) {
        return *this;
    }
    BreakIterator::operator=(that);

    if (fLanguageBreakEngines != NULL) {
        delete fLanguageBreakEngines;
        fLanguageBreakEngines = NULL;   // Just rebuild for now
    }
    // TODO: clone fLanguageBreakEngines from "that"
    UErrorCode status = U_ZERO_ERROR;
    utext_clone(&fText, &that.fText, FALSE, TRUE, &status);

    if (fCharIter != &fSCharIter) {
        delete fCharIter;
    }
    fCharIter = &fSCharIter;

    if (that.fCharIter != NULL && that.fCharIter != &that.fSCharIter) {
        // This is a little bit tricky - it will intially appear that
        //  this->fCharIter is adopted, even if that->fCharIter was
        //  not adopted.  That's ok.
        fCharIter = that.fCharIter->clone();
    }
    fSCharIter = that.fSCharIter;
    if (fCharIter == NULL) {
        fCharIter = &fSCharIter;
    }

    if (fData != NULL) {
        fData->removeReference();
        fData = NULL;
    }
    if (that.fData != NULL) {
        fData = that.fData->addReference();
    }

    fPosition = that.fPosition;
    fRuleStatusIndex = that.fRuleStatusIndex;
    fDone = that.fDone;

    // TODO: both the dictionary and the main cache need to be copied.
    //       Current position could be within a dictionary range. Trying to continue
    //       the iteration without the caches present would go to the rules, with
    //       the assumption that the current position is on a rule boundary.
    fBreakCache->reset(fPosition, fRuleStatusIndex);
    fDictionaryCache->reset();

    return *this;
}